

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultipoleAtomTypesSectionParser.cpp
# Opt level: O2

void __thiscall
OpenMD::MultipoleAtomTypesSectionParser::parseLine
          (MultipoleAtomTypesSectionParser *this,ForceField *ff,string *line,int lineNo)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  char *__format;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  bool isDipole;
  RealType RVar5;
  RealType RVar6;
  RealType RVar7;
  RealType dipoleMoment;
  Vector3d quadrupoleMoments;
  MultipoleAdapter ma;
  string multipoleType;
  string atomTypeName;
  StringTokenizer tokenizer;
  Vector3d dipole;
  Mat3x3d quadrupole;
  RotMat3x3d eFrame;
  RealType local_2c0;
  Vector<double,_3U> local_2b8;
  MultipoleAdapter local_2a0;
  string local_298;
  string local_278;
  StringTokenizer local_258;
  Vector<double,_3U> local_200;
  RectMatrix<double,_3U,_3U> local_1e8;
  RectMatrix<double,_3U,_3U> local_1a0;
  Vector<double,_3U> local_158;
  SquareMatrix3<double> local_140;
  RectMatrix<double,_3U,_3U> local_f8;
  RectMatrix<double,_3U,_3U> local_b0;
  RectMatrix<double,_3U,_3U> local_68;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0," ;\t\n\r",(allocator<char> *)&local_1e8);
  StringTokenizer::StringTokenizer(&local_258,line,(string *)&local_1a0);
  std::__cxx11::string::~string((string *)&local_1a0);
  iVar3 = StringTokenizer::countTokens(&local_258);
  if (iVar3 < 5) {
    snprintf(painCave.errMsg,2000,
             "MultipoleAtomTypesSectionParser Error: Not enough tokens at line %d\n",
             (ulong)(uint)lineNo);
    painCave.isFatal = 1;
    simError();
    goto LAB_001caab8;
  }
  StringTokenizer::nextToken_abi_cxx11_(&local_278,&local_258);
  StringTokenizer::nextToken_abi_cxx11_(&local_298,&local_258);
  RVar5 = StringTokenizer::nextTokenAsDouble(&local_258);
  RVar6 = StringTokenizer::nextTokenAsDouble(&local_258);
  RVar7 = StringTokenizer::nextTokenAsDouble(&local_258);
  local_2a0.at_ = ForceField::getAtomType(ff,&local_278);
  if (local_2a0.at_ == (AtomType *)0x0) {
    snprintf(painCave.errMsg,2000,
             "MultipoleAtomTypesSectionParser Error: Can not find matched AtomType[%s] at line %d\n"
             ,local_278._M_dataplus._M_p,(ulong)(uint)lineNo);
    painCave.isFatal = 1;
    simError();
  }
  RectMatrix<double,_3U,_3U>::RectMatrix(&local_1a0,0.0);
  SquareMatrix3<double>::setupRotMat
            ((SquareMatrix3<double> *)&local_1a0,(RVar5 * 3.141592653589793) / 180.0,
             (RVar6 * 3.141592653589793) / 180.0,(RVar7 * 3.141592653589793) / 180.0);
  local_2c0 = 0.0;
  Vector<double,_3U>::Vector(&local_200,(Vector<double,_3U> *)OpenMD::V3Zero);
  Vector<double,_3U>::Vector(&local_2b8,(Vector<double,_3U> *)OpenMD::V3Zero);
  RectMatrix<double,_3U,_3U>::RectMatrix(&local_1e8,0.0);
  pbVar4 = &local_298;
  bVar1 = std::operator==(pbVar4,"d");
  if (bVar1) {
    parseDipole((MultipoleAtomTypesSectionParser *)pbVar4,&local_258,&local_2c0,lineNo);
LAB_001ca8ca:
    RVar5 = local_2c0;
    SquareMatrix3<double>::transpose
              ((SquareMatrix3<double> *)&local_f8,(SquareMatrix3<double> *)&local_1a0);
    operator*(&local_b0,RVar5,&local_f8);
    operator*((Vector<double,_3U> *)&local_140,&local_b0,(Vector<double,_3U> *)OpenMD::V3Z);
    Vector3<double>::operator=((Vector3<double> *)&local_200,(Vector<double,_3U> *)&local_140);
    isDipole = true;
    bVar2 = true;
    if (bVar1) {
      bVar1 = false;
    }
    else {
LAB_001ca9c6:
      isDipole = bVar2;
      local_1e8.data_[0][0] = local_2b8.data_[0];
      local_1e8.data_[1][1] = local_2b8.data_[1];
      local_1e8.data_[2][2] = local_2b8.data_[2];
      SquareMatrix3<double>::transpose(&local_140,(SquareMatrix3<double> *)&local_1a0);
      operator*((SquareMatrix3<double> *)&local_f8,&local_140,(SquareMatrix3<double> *)&local_1e8);
      operator*((SquareMatrix3<double> *)&local_b0,(SquareMatrix3<double> *)&local_f8,
                (SquareMatrix3<double> *)&local_1a0);
      RectMatrix<double,_3U,_3U>::operator=(&local_1e8,&local_b0);
      bVar1 = true;
    }
  }
  else {
    bVar2 = std::operator==(&local_298,"s");
    if (bVar2) {
      __format = 
      "MultipoleAtomTypesSectionParser Error: \n\tsplit dipoles (type s) have been deprecated (line: %d)\n"
      ;
    }
    else {
      pbVar4 = &local_298;
      bVar2 = std::operator==(pbVar4,"q");
      if (bVar2) {
        parseQuadrupole((MultipoleAtomTypesSectionParser *)pbVar4,&local_258,(Vector3d *)&local_2b8,
                        lineNo);
        bVar2 = false;
        goto LAB_001ca9c6;
      }
      pbVar4 = &local_298;
      bVar2 = std::operator==(pbVar4,"dq");
      if (bVar2) {
        parseDipole((MultipoleAtomTypesSectionParser *)pbVar4,&local_258,&local_2c0,lineNo);
        parseQuadrupole((MultipoleAtomTypesSectionParser *)pbVar4,&local_258,(Vector3d *)&local_2b8,
                        lineNo);
        goto LAB_001ca8ca;
      }
      bVar1 = std::operator==(&local_298,"sq");
      __format = "MultipoleAtomTypesSectionParser Error: unrecognized multiple type at line %d\n";
      if (bVar1) {
        __format = 
        "MultipoleAtomTypesSectionParser Error: \n\tsplit dipole quadrupoles (type sq) have been deprecated (line: %d)\n"
        ;
      }
    }
    isDipole = false;
    snprintf(painCave.errMsg,2000,__format,(ulong)(uint)lineNo);
    painCave.isFatal = 1;
    simError();
    bVar1 = false;
  }
  Vector<double,_3U>::Vector(&local_158,&local_200);
  RectMatrix<double,_3U,_3U>::operator=(&local_68,&local_1e8);
  MultipoleAdapter::makeMultipole
            (&local_2a0,(Vector3d *)&local_158,(Mat3x3d *)&local_68,isDipole,bVar1);
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::string::~string((string *)&local_278);
LAB_001caab8:
  StringTokenizer::~StringTokenizer(&local_258);
  return;
}

Assistant:

void MultipoleAtomTypesSectionParser::parseLine(ForceField& ff,
                                                  const std::string& line,
                                                  int lineNo) {
    StringTokenizer tokenizer(line);
    int nTokens = tokenizer.countTokens();

    // name multipole_type theta phi psi
    // "name" must match the name in the AtomTypes section
    //
    // avaliable multipole types are:
    // d  (dipole)
    // q  (quadrupole)
    // dq (dipole plus quadrupole)
    //
    // Directionality for dipoles and quadrupoles is given by three
    // euler angles (phi, theta, psi), because the body-fixed
    // reference frame for directional atoms is determined by the
    // *mass* distribution and not by the charge distribution.
    //
    // Dipoles are given in units of Debye
    // Quadrupoles are given in units of esu centibarn
    //
    // Examples:
    //
    // name d phi theta psi dipole_moment
    // name q phi theta psi Qxx Qyy Qzz
    // name dq phi theta psi dipole_moment Qxx Qyy Qzz

    if (nTokens < 5) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "MultipoleAtomTypesSectionParser Error: Not enough tokens at "
               "line %d\n",
               lineNo);
      painCave.isFatal = 1;
      simError();
    } else {
      std::string atomTypeName  = tokenizer.nextToken();
      std::string multipoleType = tokenizer.nextToken();
      RealType phi   = tokenizer.nextTokenAsDouble() * Constants::PI / 180.0;
      RealType theta = tokenizer.nextTokenAsDouble() * Constants::PI / 180.0;
      RealType psi   = tokenizer.nextTokenAsDouble() * Constants::PI / 180.0;

      AtomType* atomType = ff.getAtomType(atomTypeName);
      if (atomType == NULL) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "MultipoleAtomTypesSectionParser Error: Can not find matched "
                 "AtomType[%s] "
                 "at line %d\n",
                 atomTypeName.c_str(), lineNo);
        painCave.isFatal = 1;
        simError();
      }

      MultipoleAdapter ma = MultipoleAdapter(atomType);

      RotMat3x3d eFrame(0.0);

      eFrame.setupRotMat(phi, theta, psi);

      RealType dipoleMoment(0);
      Vector3d dipole(V3Zero);
      Vector3d quadrupoleMoments(V3Zero);
      Mat3x3d quadrupole(0.0);

      bool isDipole(false);
      bool isQuadrupole(false);

      if (multipoleType == "d") {
        parseDipole(tokenizer, dipoleMoment, lineNo);
        isDipole = true;
      } else if (multipoleType == "s") {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "MultipoleAtomTypesSectionParser Error: \n"
                 "\tsplit dipoles (type s) have been deprecated (line: %d)\n",
                 lineNo);
        painCave.isFatal = 1;
        simError();
      } else if (multipoleType == "q") {
        parseQuadrupole(tokenizer, quadrupoleMoments, lineNo);
        isQuadrupole = true;
      } else if (multipoleType == "dq") {
        parseDipole(tokenizer, dipoleMoment, lineNo);
        isDipole = true;
        parseQuadrupole(tokenizer, quadrupoleMoments, lineNo);
        isQuadrupole = true;
      } else if (multipoleType == "sq") {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "MultipoleAtomTypesSectionParser Error: \n"
                 "\tsplit dipole quadrupoles (type sq) have been deprecated "
                 "(line: %d)\n",
                 lineNo);
        painCave.isFatal = 1;
        simError();
      } else {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "MultipoleAtomTypesSectionParser Error: unrecognized multiple "
                 "type at line "
                 "%d\n",
                 lineNo);
        painCave.isFatal = 1;
        simError();
      }
      if (isDipole) dipole = dipoleMoment * eFrame.transpose() * V3Z;
      if (isQuadrupole) {
        quadrupole(0, 0) = quadrupoleMoments(0);
        quadrupole(1, 1) = quadrupoleMoments(1);
        quadrupole(2, 2) = quadrupoleMoments(2);
        quadrupole       = eFrame.transpose() * quadrupole * eFrame;
      }

      ma.makeMultipole(dipole, quadrupole, isDipole, isQuadrupole);
    }
  }